

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::UntypedMapBase::EraseFromTree
          (UntypedMapBase *this,map_index_t b,iterator tree_it)

{
  TableEntryPtr TVar1;
  bool bVar2;
  reference ppVar3;
  NodeBase *node;
  undefined8 uVar4;
  NodeBase *pNVar5;
  GetKey get_key;
  UntypedMapBase *this_00;
  btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *pbVar6;
  iterator iVar7;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  bStack_c0;
  NodeBase NStack_a8;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>,_bool>
  pStack_a0;
  _Head_base<0UL,_google::protobuf::internal::NodeBase_*&,_false> _Stack_88;
  VariantKey VStack_80;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  local_40;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  local_30;
  
  pNVar5 = tree_it._8_8_;
  local_40.node_ = tree_it.node_;
  local_40.position_ = tree_it.position_;
  TVar1 = this->table_[b];
  if ((TVar1 & 1) != 0) {
    pbVar6 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
              *)(TVar1 - 1);
    iVar7 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            ::begin(pbVar6);
    bVar2 = absl::lts_20240722::container_internal::
            btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
            ::Equals(&local_40,(const_iterator)iVar7);
    if (!bVar2) {
      local_30.node_ = local_40.node_;
      local_30.position_ = local_40.position_;
      absl::lts_20240722::container_internal::
      btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
      ::decrement(&local_30);
      ppVar3 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
               ::operator*(&local_30);
      ppVar3->second->next = ppVar3->second->next->next;
    }
    iVar7.position_ = local_40.position_;
    iVar7.node_ = local_40.node_;
    iVar7._12_4_ = 0;
    absl::lts_20240722::container_internal::
    btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
    ::erase(pbVar6,iVar7);
    if (*(long *)(TVar1 + 0x17) == 0) {
      DestroyTree(this,(Tree *)pbVar6);
      this->table_[b] = 0;
    }
    return;
  }
  this_00 = (UntypedMapBase *)&local_30;
  EraseFromTree(this_00);
  node = (NodeBase *)this_00->table_[b];
  NStack_a8.next = pNVar5;
  if (((ulong)node & 1) == 0 && node != (NodeBase *)0x0) {
    node = (NodeBase *)ConvertToTree(this_00,node,get_key);
    this_00->table_[b] = (TableEntryPtr)node;
  }
  if (((ulong)node & 1) != 0) {
    pbVar6 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
              *)((long)&node[-1].next + 7);
    VStack_80 = (*get_key)(pNVar5);
    bStack_c0.node_ =
         (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
          *)&VStack_80;
    _Stack_88._M_head_impl = &NStack_a8.next;
    absl::lts_20240722::container_internal::
    btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,google::protobuf::internal::NodeBase*,std::less<google::protobuf::internal::VariantKey>,google::protobuf::internal::MapAllocator<std::pair<google::protobuf::internal::VariantKey_const,google::protobuf::internal::NodeBase*>>,256,false>>
    ::
    insert_unique<google::protobuf::internal::VariantKey,std::piecewise_construct_t_const&,std::tuple<google::protobuf::internal::VariantKey&&>,std::tuple<google::protobuf::internal::NodeBase*&>>
              (&pStack_a0,
               (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,google::protobuf::internal::NodeBase*,std::less<google::protobuf::internal::VariantKey>,google::protobuf::internal::MapAllocator<std::pair<google::protobuf::internal::VariantKey_const,google::protobuf::internal::NodeBase*>>,256,false>>
                *)pbVar6,(VariantKey *)bStack_c0.node_,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<google::protobuf::internal::VariantKey_&&> *)&bStack_c0,
               (tuple<google::protobuf::internal::NodeBase_*&> *)&_Stack_88);
    bStack_c0.position_ = pStack_a0.first.position_;
    bStack_c0.node_ = pStack_a0.first.node_;
    iVar7 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            ::begin(pbVar6);
    bVar2 = absl::lts_20240722::container_internal::
            btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
            ::Equals(&bStack_c0,(const_iterator)iVar7);
    if (!bVar2) {
      pStack_a0.first.node_ = bStack_c0.node_;
      pStack_a0.first.position_ = bStack_c0.position_;
      absl::lts_20240722::container_internal::
      btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
      ::decrement(&pStack_a0.first);
      ppVar3 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
               ::operator*(&pStack_a0.first);
      ppVar3->second->next = NStack_a8.next;
    }
    pStack_a0.first.node_ = bStack_c0.node_;
    pStack_a0.first.position_ = bStack_c0.position_;
    absl::lts_20240722::container_internal::
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
    ::increment(&pStack_a0.first);
    iVar7 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            ::end(pbVar6);
    bVar2 = absl::lts_20240722::container_internal::
            btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
            ::Equals(&pStack_a0.first,(const_iterator)iVar7);
    if (bVar2) {
      pNVar5 = (NodeBase *)0x0;
    }
    else {
      ppVar3 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
               ::operator*(&pStack_a0.first);
      pNVar5 = ppVar3->second;
    }
    (NStack_a8.next)->next = pNVar5;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&pStack_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map.cc"
             ,0x3c,0x13,"TableEntryIsTree(b)");
  bStack_c0.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
        *)this_00->table_[b];
  uVar4 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIPvTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS6_
                    (&pStack_a0);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(uVar4,1," ");
  bStack_c0.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
        *)this_00->table_[b];
  _ZN4absl12lts_2024072212log_internal10LogMessagelsImTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
            (uVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&pStack_a0)
  ;
}

Assistant:

void UntypedMapBase::EraseFromTree(map_index_t b,
                                   typename Tree::iterator tree_it) {
  ABSL_DCHECK(TableEntryIsTree(b));
  Tree* tree = TableEntryToTree(table_[b]);
  if (tree_it != tree->begin()) {
    NodeBase* prev = std::prev(tree_it)->second;
    prev->next = prev->next->next;
  }
  tree->erase(tree_it);
  if (tree->empty()) {
    DestroyTree(tree);
    table_[b] = TableEntryPtr{};
  }
}